

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O3

size_t ZSTD_decompressSequences_bmi2
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  BYTE BVar4;
  size_t sVar5;
  seq_t sequence;
  uint uVar6;
  int iVar7;
  BYTE *op_2;
  long lVar8;
  BYTE *pBVar9;
  ulong uVar10;
  BYTE *pBVar11;
  BYTE *pBVar12;
  BYTE *oend;
  BYTE *pBVar13;
  BYTE *pBVar14;
  ulong uVar15;
  void *pvVar16;
  BYTE *pBVar17;
  uint uVar18;
  BYTE *ip_1;
  ulong uVar19;
  size_t sVar20;
  bool bVar21;
  BYTE *litPtr;
  seqState_t seqState;
  BYTE *local_140;
  BIT_DStream_t local_138;
  ZSTD_fseState local_110;
  ZSTD_fseState local_100;
  ZSTD_fseState local_f0;
  ulong local_e0 [6];
  BYTE *local_b0;
  BYTE *local_a8;
  BYTE *local_a0;
  BYTE *local_98;
  BYTE *local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  void *local_70;
  BYTE *local_68;
  ulong *local_60;
  size_t local_58;
  ulong local_50;
  size_t sStack_48;
  ulong local_40;
  BYTE *pBStack_38;
  
  pBVar17 = (BYTE *)(maxDstSize + (long)dst);
  local_140 = dctx->litPtr;
  sVar5 = dctx->litSize;
  pBVar12 = local_140 + sVar5;
  pvVar16 = dst;
  if (nbSeq == 0) {
LAB_0015105d:
    sVar20 = (long)pBVar12 - (long)local_140;
    pBVar12 = (BYTE *)0xffffffffffffffba;
    if (sVar20 <= (ulong)((long)pBVar17 - (long)dst)) {
      memcpy(dst,local_140,sVar20);
      pBVar12 = (BYTE *)((long)dst + (sVar20 - (long)pvVar16));
    }
  }
  else {
    pBVar12 = (BYTE *)dctx->prefixStart;
    local_98 = (BYTE *)dctx->virtualStart;
    local_a0 = (BYTE *)dctx->dictEnd;
    dctx->fseEntropy = 1;
    lVar8 = -0xc;
    do {
      *(ulong *)((long)local_e0 + lVar8 * 2 + 0x18) =
           (ulong)*(uint *)((long)dctx->workspace + lVar8);
      lVar8 = lVar8 + 4;
    } while (lVar8 != 0);
    if (seqSize != 0) {
      local_138.limitPtr = (char *)((long)seqStart + 8);
      if (seqSize < 8) {
        local_138.bitContainer = (size_t)*seqStart;
        switch(seqSize) {
        case 7:
          local_138.bitContainer =
               local_138.bitContainer | (ulong)*(byte *)((long)seqStart + 6) << 0x30;
        case 6:
          local_138.bitContainer =
               local_138.bitContainer + ((ulong)*(byte *)((long)seqStart + 5) << 0x28);
        case 5:
          local_138.bitContainer =
               local_138.bitContainer + ((ulong)*(byte *)((long)seqStart + 4) << 0x20);
        case 4:
          local_138.bitContainer =
               local_138.bitContainer + (ulong)*(byte *)((long)seqStart + 3) * 0x1000000;
        case 3:
          local_138.bitContainer =
               local_138.bitContainer + (ulong)*(byte *)((long)seqStart + 2) * 0x10000;
        case 2:
          local_138.bitContainer =
               (ulong)*(byte *)((long)seqStart + 1) * 0x100 + local_138.bitContainer;
        }
        bVar1 = *(byte *)((long)seqStart + (seqSize - 1));
        if (bVar1 != 0) {
          uVar6 = 0x1f;
          if (bVar1 != 0) {
            for (; bVar1 >> uVar6 == 0; uVar6 = uVar6 - 1) {
            }
          }
          local_138.bitsConsumed = (uVar6 ^ 0x1f) + (int)seqSize * -8 + 0x29;
          local_138.ptr = (char *)seqStart;
LAB_001509fe:
          local_138.start = (char *)seqStart;
          local_90 = local_140 + sVar5;
          ZSTD_initFseState(&local_110,&local_138,dctx->LLTptr);
          ZSTD_initFseState(&local_100,&local_138,dctx->OFTptr);
          ZSTD_initFseState(&local_f0,&local_138,dctx->MLTptr);
          local_a8 = pBVar17 + -8;
          local_b0 = pBVar17;
          local_68 = pBVar17 + -0xd;
          local_70 = dst;
LAB_00150a74:
          uVar19 = local_e0[1];
          uVar10 = (ulong)local_138.bitsConsumed;
          if (uVar10 < 0x41) {
            if (local_138.ptr < local_138.limitPtr) {
              if (local_138.ptr != local_138.start) {
                uVar6 = (int)local_138.ptr - (int)local_138.start;
                if (local_138.start <=
                    (ulong *)((long)local_138.ptr - (ulong)(local_138.bitsConsumed >> 3))) {
                  uVar6 = local_138.bitsConsumed >> 3;
                }
                local_138.bitsConsumed = local_138.bitsConsumed + uVar6 * -8;
                goto LAB_00150ad4;
              }
            }
            else {
              uVar6 = local_138.bitsConsumed >> 3;
              local_138.bitsConsumed = local_138.bitsConsumed & 7;
LAB_00150ad4:
              local_138.ptr = (char *)((long)local_138.ptr - (ulong)uVar6);
              uVar10 = (ulong)local_138.bitsConsumed;
              local_138.bitContainer = *(size_t *)local_138.ptr;
            }
            bVar21 = nbSeq != 0;
            nbSeq = nbSeq + -1;
            uVar6 = (uint)uVar10;
            if (bVar21) {
              local_60 = (ulong *)local_138.limitPtr;
              bVar1 = local_110.table[local_110.state].nbAdditionalBits;
              bVar2 = local_f0.table[local_f0.state].nbAdditionalBits;
              bVar3 = local_100.table[local_100.state].nbAdditionalBits;
              local_78 = (ulong)local_110.table[local_110.state].baseValue;
              local_88 = (ulong)local_f0.table[local_f0.state].baseValue;
              local_58 = local_100.state;
              uVar18 = (uint)bVar3;
              if (bVar3 == 0) {
                uVar15 = 0;
LAB_00150b9b:
                lVar8 = (local_78 == 0) + uVar15;
                if (lVar8 != 0) {
                  if (lVar8 == 3) {
                    uVar15 = (local_e0[0] - 1) + (ulong)(local_e0[0] == 1);
LAB_00150bec:
                    local_e0[2] = local_e0[1];
                  }
                  else {
                    uVar15 = local_e0[lVar8] + (ulong)(local_e0[lVar8] == 0);
                    if (lVar8 != 1) goto LAB_00150bec;
                  }
                  local_e0[1] = local_e0[0];
                  goto LAB_00150c0c;
                }
              }
              else {
                uVar15 = ((local_138.bitContainer << (uVar10 & 0x3f)) >>
                         ((ulong)(byte)-bVar3 & 0x3f)) +
                         (ulong)local_100.table[local_100.state].baseValue;
                uVar10 = (ulong)(uVar6 + uVar18);
                if (uVar18 == 1) goto LAB_00150b9b;
                local_e0[1] = local_e0[0];
                local_e0[2] = uVar19;
LAB_00150c0c:
                local_e0[1] = local_e0[0];
                local_e0[0] = uVar15;
              }
              local_80 = local_e0[0];
              if (bVar2 == 0) {
                uVar19 = 0;
              }
              else {
                uVar19 = (local_138.bitContainer << (uVar10 & 0x3f)) >> ((ulong)(byte)-bVar2 & 0x3f)
                ;
                uVar10 = (ulong)((int)uVar10 + (uint)bVar2);
              }
              if ((0x1e < (uint)bVar2 + (uint)bVar1 + uVar18) &&
                 (uVar6 = (uint)uVar10, uVar6 < 0x41)) {
                if (local_138.ptr < local_138.limitPtr) {
                  if (local_138.ptr == local_138.start) goto LAB_00150cae;
                  uVar15 = (ulong)(uint)((int)local_138.ptr - (int)local_138.start);
                  if (local_138.start <= (ulong *)((long)local_138.ptr - (uVar10 >> 3))) {
                    uVar15 = uVar10 >> 3;
                  }
                  uVar6 = uVar6 + (int)uVar15 * -8;
                }
                else {
                  uVar15 = uVar10 >> 3;
                  uVar6 = uVar6 & 7;
                }
                local_138.ptr = (char *)((long)local_138.ptr - uVar15);
                uVar10 = (ulong)uVar6;
                local_138.bitContainer = *(size_t *)local_138.ptr;
              }
LAB_00150cae:
              iVar7 = (int)uVar10;
              if (bVar1 == 0) {
                local_50 = 0;
              }
              else {
                local_50 = (local_138.bitContainer << (uVar10 & 0x3f)) >>
                           ((ulong)(byte)-bVar1 & 0x3f);
                iVar7 = iVar7 + (uint)bVar1;
              }
              sVar20 = uVar19 + local_f0.table[local_f0.state].baseValue;
              local_50 = local_50 + local_78;
              iVar7 = iVar7 + (uint)local_110.table[local_110.state].nbBits;
              local_110.state =
                   (ulong)((uint)(local_138.bitContainer >> ((ulong)(byte)-(char)iVar7 & 0x3f)) &
                          BIT_mask[local_110.table[local_110.state].nbBits]) +
                   (ulong)local_110.table[local_110.state].nextState;
              iVar7 = iVar7 + (uint)local_f0.table[local_f0.state].nbBits;
              local_f0.state =
                   (ulong)((uint)(local_138.bitContainer >> ((ulong)(byte)-(char)iVar7 & 0x3f)) &
                          BIT_mask[local_f0.table[local_f0.state].nbBits]) +
                   (ulong)local_f0.table[local_f0.state].nextState;
              local_138.bitsConsumed = iVar7 + (uint)local_100.table[local_100.state].nbBits;
              local_100.state =
                   (ulong)((uint)(local_138.bitContainer >>
                                 ((ulong)(byte)-(char)local_138.bitsConsumed & 0x3f)) &
                          BIT_mask[local_100.table[local_100.state].nbBits]) +
                   (ulong)local_100.table[local_100.state].nextState;
              sStack_48 = sVar20;
              local_40 = local_e0[0];
              uVar19 = local_50 + sVar20;
              pBVar17 = (BYTE *)((long)dst + uVar19);
              if (local_b0 < pBVar17) {
                return 0xffffffffffffffba;
              }
              pBVar9 = local_140 + local_50;
              if (local_90 < pBVar9) {
                return 0xffffffffffffffec;
              }
              pBVar13 = (BYTE *)((long)dst + local_50);
              if (local_a8 < pBVar13) {
                sequence.matchLength = sVar20;
                sequence.litLength = local_50;
                sequence.offset = local_e0[0];
                sequence.match = pBStack_38;
                uVar19 = ZSTD_execSequenceLast7
                                   ((BYTE *)dst,local_b0,sequence,&local_140,local_90,pBVar12,
                                    local_98,local_a0);
              }
              else {
                *(undefined8 *)dst = *(undefined8 *)local_140;
                if (8 < local_50) {
                  pBVar14 = (BYTE *)((long)dst + 8);
                  do {
                    local_140 = local_140 + 8;
                    *(undefined8 *)pBVar14 = *(undefined8 *)local_140;
                    pBVar14 = pBVar14 + 8;
                  } while (pBVar14 < pBVar13);
                }
                pBVar14 = pBVar13 + -local_e0[0];
                local_140 = pBVar9;
                if ((ulong)((long)pBVar13 - (long)pBVar12) < local_e0[0]) {
                  if ((ulong)((long)pBVar13 - (long)local_98) < local_e0[0]) {
                    return 0xffffffffffffffec;
                  }
                  lVar8 = (long)(pBVar13 + -local_e0[0]) - (long)pBVar12;
                  pBVar9 = local_a0 + lVar8;
                  if (local_a0 < pBVar9 + sVar20) {
                    memmove(pBVar13,pBVar9,-lVar8);
                    pBVar13 = pBVar13 + -lVar8;
                    sStack_48 = sVar20 + lVar8;
                    if ((pBVar13 <= local_a8) && (pBVar14 = pBVar12, 2 < sStack_48))
                    goto LAB_00150edf;
                    if (sStack_48 != 0) {
                      uVar10 = 0;
                      do {
                        pBVar13[uVar10] = pBVar12[uVar10];
                        uVar10 = uVar10 + 1;
                      } while ((uVar10 & 0xffffffff) < sStack_48);
                    }
                  }
                  else {
                    memmove(pBVar13,pBVar9,sVar20);
                  }
                }
                else {
LAB_00150edf:
                  if (local_80 < 8) {
                    iVar7 = *(int *)(ZSTD_execSequence_dec64table + local_80 * 4);
                    *pBVar13 = *pBVar14;
                    pBVar13[1] = pBVar14[1];
                    pBVar13[2] = pBVar14[2];
                    pBVar13[3] = pBVar14[3];
                    pBVar9 = pBVar14 + *(uint *)(ZSTD_execSequence_dec32table + local_40 * 4);
                    pBVar14 = pBVar14 + ((ulong)*(uint *)(ZSTD_execSequence_dec32table +
                                                         local_40 * 4) - (long)iVar7);
                    *(undefined4 *)(pBVar13 + 4) = *(undefined4 *)pBVar9;
                  }
                  else {
                    *(undefined8 *)pBVar13 = *(undefined8 *)pBVar14;
                  }
                  pBVar9 = pBVar13 + 8;
                  pBVar14 = pBVar14 + 8;
                  if (local_68 < pBVar17) {
                    pBVar13 = pBVar9;
                    pBVar11 = pBVar14;
                    if (pBVar9 < local_a8) {
                      do {
                        *(undefined8 *)pBVar13 = *(undefined8 *)pBVar11;
                        pBVar13 = pBVar13 + 8;
                        pBVar11 = pBVar11 + 8;
                      } while (pBVar13 < local_a8);
                      pBVar14 = pBVar14 + ((long)local_a8 - (long)pBVar9);
                      pBVar9 = local_a8;
                    }
                    for (; pBVar9 < pBVar17; pBVar9 = pBVar9 + 1) {
                      BVar4 = *pBVar14;
                      pBVar14 = pBVar14 + 1;
                      *pBVar9 = BVar4;
                    }
                  }
                  else {
                    do {
                      *(undefined8 *)pBVar9 = *(undefined8 *)pBVar14;
                      pBVar9 = pBVar9 + 8;
                      pBVar14 = pBVar14 + 8;
                    } while (pBVar9 < pBVar13 + sStack_48);
                  }
                }
              }
              dst = (void *)((long)dst + uVar19);
              if (0xffffffffffffff88 < uVar19) {
                return uVar19;
              }
              goto LAB_00150a74;
            }
            if (uVar6 < 0x41) {
              if ((local_138.ptr < local_138.limitPtr) && (local_138.ptr == local_138.start)) {
                if (uVar6 != 0x40) {
                  return 0xffffffffffffffec;
                }
                goto LAB_00151026;
              }
              goto LAB_00151088;
            }
          }
          else if (nbSeq != 0) {
            return 0xffffffffffffffec;
          }
LAB_00151026:
          lVar8 = 0;
          do {
            (dctx->entropy).rep[lVar8] = (U32)local_e0[lVar8];
            lVar8 = lVar8 + 1;
            pBVar12 = local_90;
            pvVar16 = local_70;
            pBVar17 = local_b0;
          } while (lVar8 != 3);
          goto LAB_0015105d;
        }
      }
      else {
        local_138.ptr = (char *)((long)seqStart + (seqSize - 8));
        local_138.bitContainer = *(size_t *)local_138.ptr;
        if (local_138.bitContainer >> 0x38 != 0) {
          uVar6 = 0x1f;
          bVar1 = (byte)(local_138.bitContainer >> 0x38);
          if (bVar1 != 0) {
            for (; bVar1 >> uVar6 == 0; uVar6 = uVar6 - 1) {
            }
          }
          local_138.bitsConsumed = ~uVar6 + 9;
          if (seqSize < 0xffffffffffffff89) goto LAB_001509fe;
        }
      }
    }
LAB_00151088:
    pBVar12 = (BYTE *)0xffffffffffffffec;
  }
  return (size_t)pBVar12;
}

Assistant:

size_t
ZSTD_decompressSequences_bmi2(ZSTD_DCtx* dctx,
                                 void* dst, size_t maxDstSize,
                           const void* seqStart, size_t seqSize, int nbSeq,
                           const ZSTD_longOffset_e isLongOffset)
{
    return ZSTD_decompressSequences_body(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset);
}